

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O0

amqp_socket_t * amqp_ssl_socket_new(amqp_connection_state_t state)

{
  int iVar1;
  amqp_socket_t *paVar2;
  SSL_METHOD *meth;
  SSL_CTX *pSVar3;
  int status;
  amqp_ssl_socket_t *self;
  amqp_socket_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  paVar2 = (amqp_socket_t *)calloc(1,0x38);
  if (paVar2 != (amqp_socket_t *)0x0) {
    *(undefined4 *)&paVar2[2].klass = 0xffffffff;
    paVar2->klass = &amqp_ssl_socket_class;
    *(undefined4 *)&paVar2[6].klass = 1;
    iVar1 = initialize_openssl();
    if (iVar1 == 0) {
      meth = (SSL_METHOD *)TLS_client_method();
      pSVar3 = SSL_CTX_new(meth);
      paVar2[1].klass = (amqp_socket_class_t *)pSVar3;
      if (paVar2[1].klass != (amqp_socket_class_t *)0x0) {
        amqp_set_socket((amqp_connection_state_t)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffd8);
        return paVar2;
      }
    }
    amqp_ssl_socket_delete((void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  }
  return (amqp_socket_t *)0x0;
}

Assistant:

amqp_socket_t *
amqp_ssl_socket_new(amqp_connection_state_t state)
{
  struct amqp_ssl_socket_t *self = calloc(1, sizeof(*self));
  int status;
  if (!self) {
    return NULL;
  }

  self->sockfd = -1;
  self->klass = &amqp_ssl_socket_class;
  self->verify = 1;

  status = initialize_openssl();
  if (status) {
    goto error;
  }

  self->ctx = SSL_CTX_new(SSLv23_client_method());
  if (!self->ctx) {
    goto error;
  }

  amqp_set_socket(state, (amqp_socket_t *)self);

  return (amqp_socket_t *)self;
error:
  amqp_ssl_socket_delete((amqp_socket_t *)self);
  return NULL;
}